

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O1

void __thiscall Privkey_Privkey_Test::TestBody(Privkey_Privkey_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Privkey privkey;
  ByteData local_70;
  string local_58;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  Privkey local_28;
  
  cfd::core::Privkey::Privkey(&local_28);
  cfd::core::Privkey::GetData(&local_70,&local_28);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_58,&local_70);
  message = "";
  testing::internal::CmpHelperSTREQ
            (local_38,"privkey.GetData().GetHex().c_str()","\"\"",local_58._M_dataplus._M_p,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_30.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x16,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_58._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
      }
      local_58._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Privkey, Privkey) {
  Privkey privkey;
  EXPECT_STREQ(privkey.GetData().GetHex().c_str(), "");
}